

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGReg tcg_reg_alloc(TCGContext_conflict9 *s,TCGRegSet required_regs,TCGRegSet allocated_regs,
                    TCGRegSet preferred_regs,_Bool rev)

{
  TCGRegSet TVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  TCGReg TVar5;
  int *local_70;
  bool local_61;
  TCGReg reg_3;
  TCGReg reg_2;
  TCGRegSet set_1;
  TCGReg reg_1;
  TCGReg reg;
  TCGRegSet set;
  int *order;
  TCGRegSet reg_ct [2];
  int n;
  int f;
  int j;
  int i;
  _Bool rev_local;
  TCGRegSet preferred_regs_local;
  TCGRegSet allocated_regs_local;
  TCGRegSet required_regs_local;
  TCGContext_conflict9 *s_local;
  
  reg_ct[0] = 0x1f;
  uVar3 = required_regs & (allocated_regs ^ 0xffffffff);
  uVar4 = uVar3 & preferred_regs;
  local_61 = uVar4 == 0 || uVar4 == uVar3;
  n = (int)local_61;
  reg_ct[1] = n;
  if (rev) {
    local_70 = s->indirect_reg_alloc_order;
  }
  else {
    local_70 = tcg_target_reg_alloc_order;
  }
  do {
    if (1 < n) {
      n = reg_ct[1];
      while( true ) {
        if (1 < n) {
          fprintf(_stderr,"%s:%d: tcg fatal error\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                  ,0xbe8);
          abort();
        }
        TVar1 = reg_ct[(long)n + -2];
        _Var2 = tcg_regset_single(TVar1);
        if (_Var2) break;
        for (f = 0; f < (int)reg_ct[0]; f = f + 1) {
          TVar5 = local_70[f];
          if ((TVar1 >> ((byte)TVar5 & 0x1f) & 1) != 0) {
            tcg_reg_free(s,TVar5,allocated_regs);
            return TVar5;
          }
        }
        n = n + 1;
      }
      TVar5 = tcg_regset_first(TVar1);
      tcg_reg_free(s,TVar5,allocated_regs);
      return TVar5;
    }
    TVar1 = reg_ct[(long)n + -2];
    _Var2 = tcg_regset_single(TVar1);
    if (_Var2) {
      TVar5 = tcg_regset_first(TVar1);
      if (s->reg_to_temp[TVar5] == (TCGTemp *)0x0) {
        return TVar5;
      }
    }
    else {
      for (f = 0; f < (int)reg_ct[0]; f = f + 1) {
        TVar5 = local_70[f];
        if ((s->reg_to_temp[TVar5] == (TCGTemp *)0x0) && ((TVar1 >> ((byte)TVar5 & 0x1f) & 1) != 0))
        {
          return TVar5;
        }
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

static TCGReg tcg_reg_alloc(TCGContext *s, TCGRegSet required_regs,
                            TCGRegSet allocated_regs,
                            TCGRegSet preferred_regs, bool rev)
{
    int i, j, f, n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    TCGRegSet reg_ct[2];
    const int *order;

    reg_ct[1] = required_regs & ~allocated_regs;
    tcg_debug_assert(reg_ct[1] != 0);
    reg_ct[0] = reg_ct[1] & preferred_regs;

    /* Skip the preferred_regs option if it cannot be satisfied,
       or if the preference made no difference.  */
    f = reg_ct[0] == 0 || reg_ct[0] == reg_ct[1];

    order = rev ? s->indirect_reg_alloc_order : tcg_target_reg_alloc_order;

    /* Try free registers, preferences first.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            if (s->reg_to_temp[reg] == NULL) {
                return reg;
            }
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (s->reg_to_temp[reg] == NULL &&
                    tcg_regset_test_reg(set, reg)) {
                    return reg;
                }
            }
        }
    }

    /* We must spill something.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            tcg_reg_free(s, reg, allocated_regs);
            return reg;
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (tcg_regset_test_reg(set, reg)) {
                    tcg_reg_free(s, reg, allocated_regs);
                    return reg;
                }
            }
        }
    }

    tcg_abort();
}